

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReliablePdu.cpp
# Opt level: O3

void __thiscall DIS::DataReliablePdu::~DataReliablePdu(DataReliablePdu *this)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pFVar6;
  
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu.super_PduSuperclass.
  _vptr_PduSuperclass = (_func_int **)&PTR__DataReliablePdu_001b3f90;
  pFVar1 = (this->_fixedDatumRecords).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->_fixedDatumRecords).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pFVar6 = pFVar1;
  if (pFVar2 != pFVar1) {
    do {
      (**pFVar6->_vptr_FixedDatum)(pFVar6);
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 != pFVar2);
    (this->_fixedDatumRecords).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  pVVar3 = (this->_variableDatumRecords).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4 = (this->_variableDatumRecords).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar5 = pVVar3;
  if (pVVar4 != pVVar3) {
    do {
      (**pVVar5->_vptr_VariableDatum)(pVVar5);
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar4);
    (this->_variableDatumRecords).
    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::~vector
            (&this->_variableDatumRecords);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::~vector(&this->_fixedDatumRecords)
  ;
  SimulationManagementWithReliabilityFamilyPdu::~SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  return;
}

Assistant:

DataReliablePdu::~DataReliablePdu()
{
    _fixedDatumRecords.clear();
    _variableDatumRecords.clear();
}